

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O1

void upb_test::CheckFile(FileDefPtr file,google_protobuf_FileDescriptorProto *proto)

{
  upb_Arena *a;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  char local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  google_protobuf_FileDescriptorProto *local_20;
  google_protobuf_FileDescriptorProto *local_18;
  
  local_18 = proto;
  a = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  local_20 = upb_FileDef_ToProto(file.ptr_,a);
  local_28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       google_protobuf_FileDescriptorProto_getmsgdef;
  testing::internal::
  PredicateFormatterFromMatcher<upb_test::EqualsUpbProtoMatcherP2<google_protobuf_FileDescriptorProto*,upb_MessageDef_const*(*)(upb_DefPool*)>>
  ::operator()(local_38,(char *)&local_28,(google_protobuf_FileDescriptorProto **)0x4938a8);
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.cc"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  if (a != (upb_Arena *)0x0) {
    upb_Arena_Free(a);
  }
  return;
}

Assistant:

void CheckFile(const upb::FileDefPtr file,
               const google_protobuf_FileDescriptorProto* proto) {
  upb::Arena arena;
  google_protobuf_FileDescriptorProto* proto2 =
      upb_FileDef_ToProto(file.ptr(), arena.ptr());
  ASSERT_THAT(
      proto,
      EqualsUpbProto(proto2, google_protobuf_FileDescriptorProto_getmsgdef));
}